

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int per_test_timeout_value(void)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = getenv("CGREEN_PER_TEST_TIMEOUT");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = getenv("CGREEN_PER_TEST_TIMEOUT");
    iVar1 = atoi(pcVar2);
    return iVar1;
  }
  pcVar2 = "attempt to fetch undefined value for %s\n";
  die("attempt to fetch undefined value for %s\n");
  __vprintf_chk(1,pcVar2);
  exit(1);
}

Assistant:

static int per_test_timeout_value(void)
{
    char *timeout_string;
    int timeout_value;

    if (!per_test_timeout_defined())
    {
        die("attempt to fetch undefined value for %s\n", CGREEN_PER_TEST_TIMEOUT_ENVIRONMENT_VARIABLE);
    }

    timeout_string = getenv(CGREEN_PER_TEST_TIMEOUT_ENVIRONMENT_VARIABLE);
    timeout_value = atoi(timeout_string);

    return timeout_value;
}